

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  long lVar1;
  string *in_RDI;
  handle local_208;
  handle local_200 [4];
  __cxx11 local_1e0 [32];
  handle local_1c0;
  handle local_1b8 [4];
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [36];
  int local_d4;
  _frame *p_Stack_d0;
  int lineno;
  PyFrameObject *frame;
  PyTracebackObject *trace;
  str local_b8;
  str local_b0 [4];
  handle local_90;
  str_attr_accessor local_88;
  accessor<pybind11::detail::accessor_policies::str_attr> local_68;
  undefined1 local_41;
  undefined1 local_40 [8];
  error_scope scope;
  allocator local_11 [9];
  string *errorString;
  
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    PyErr_SetString(_PyExc_RuntimeError);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Unknown internal error occurred",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else {
    error_scope::error_scope((error_scope *)local_40);
    local_41 = 0;
    std::__cxx11::string::string(in_RDI);
    if (local_40 != (undefined1  [8])0x0) {
      handle::handle(&local_90,(PyObject *)local_40);
      object_api<pybind11::handle>::attr
                (&local_88,(object_api<pybind11::handle> *)&local_90,"__name__");
      accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>(&local_68)
      ;
      std::__cxx11::string::operator+=(in_RDI,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_88);
      std::__cxx11::string::operator+=(in_RDI,": ");
    }
    if (scope.type != (PyObject *)0x0) {
      handle::handle((handle *)&trace,scope.type);
      str::str(&local_b8,(handle)trace);
      str::operator_cast_to_string(local_b0);
      std::__cxx11::string::operator+=(in_RDI,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      str::~str(&local_b8);
    }
    PyErr_NormalizeException(local_40,&scope,&scope.value);
    if (scope.value != (PyObject *)0x0) {
      PyException_SetTraceback(scope.type,scope.value);
    }
    if (scope.value != (PyObject *)0x0) {
      for (frame = (PyFrameObject *)scope.value; (frame->ob_base).ob_size != 0;
          frame = (PyFrameObject *)(frame->ob_base).ob_size) {
      }
      p_Stack_d0 = frame->f_back;
      std::__cxx11::string::operator+=(in_RDI,"\n\nAt:\n");
      for (; p_Stack_d0 != (_frame *)0x0; p_Stack_d0 = p_Stack_d0->f_back) {
        local_d4 = PyFrame_GetLineNumber(p_Stack_d0);
        handle::handle(&local_1c0,p_Stack_d0->f_code->co_filename);
        handle::cast<std::__cxx11::string>(local_1b8);
        std::operator+((char *)local_198,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x190268
                      );
        std::operator+(local_178,(char *)local_198);
        std::__cxx11::to_string(local_1e0,local_d4);
        std::operator+(local_158,local_178);
        std::operator+(local_138,(char *)local_158);
        handle::handle(&local_208,p_Stack_d0->f_code->co_name);
        handle::cast<std::__cxx11::string>(local_200);
        std::operator+(local_118,local_138);
        std::operator+(local_f8,(char *)local_118);
        std::__cxx11::string::operator+=(in_RDI,(string *)local_f8);
        std::__cxx11::string::~string((string *)local_f8);
        std::__cxx11::string::~string((string *)local_118);
        std::__cxx11::string::~string((string *)local_200);
        std::__cxx11::string::~string((string *)local_138);
        std::__cxx11::string::~string((string *)local_158);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::string::~string((string *)local_178);
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string((string *)local_1b8);
      }
    }
    local_41 = 1;
    error_scope::~error_scope((error_scope *)local_40);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}